

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

bool findInBlock(QTextBlock *block,QRegularExpression *expr,int offset,FindFlags options,
                QTextCursor *cursor)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  qsizetype qVar4;
  long lVar5;
  QTextDocumentPrivate *d;
  QTextCursor *this;
  int in_EDX;
  longlong in_RSI;
  QTextBlock *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  int end;
  int start;
  int idx;
  QRegularExpressionMatch match;
  QString text;
  undefined4 in_stack_ffffffffffffff18;
  FindFlag in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  QString *in_stack_ffffffffffffff28;
  int local_bc;
  QTextBlock *in_stack_ffffffffffffff48;
  bool local_aa;
  bool local_a9;
  int local_a0;
  int local_6c;
  bool local_51;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_48;
  char16_t local_44;
  char16_t local_42;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_40;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_3c;
  undefined1 *local_38;
  QChar local_2c;
  QChar local_2a;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::text(in_stack_ffffffffffffff48);
  QChar::QChar<QChar::SpecialCharacter,_true>(&local_2a,Nbsp);
  QChar::QChar<char16_t,_true>(&local_2c,L' ');
  QString::replace((QChar)(char16_t)&local_28,local_2a,(uint)(ushort)local_2c.ucs);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)&local_38);
  local_6c = in_EDX;
  while( true ) {
    bVar1 = false;
    if (-1 < local_6c) {
      qVar4 = QString::size(&local_28);
      bVar1 = local_6c <= qVar4;
    }
    if (!bVar1) {
      local_51 = false;
      goto LAB_007ad8a8;
    }
    local_3c.super_QFlagsStorage<QTextDocument::FindFlag>.i =
         (QFlagsStorage<QTextDocument::FindFlag>)
         QFlags<QTextDocument::FindFlag>::operator&
                   ((QFlags<QTextDocument::FindFlag> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
    if (IVar2 == 0) {
      local_a0 = QString::indexOf((QRegularExpression *)&local_28,in_RSI,
                                  (QRegularExpressionMatch *)(long)local_6c);
    }
    else {
      local_a0 = QString::lastIndexOf
                           ((QRegularExpression *)&local_28,in_RSI,
                            (QRegularExpressionMatch *)(long)local_6c);
    }
    if (local_a0 == -1) {
      local_51 = false;
      goto LAB_007ad8a8;
    }
    local_40.super_QFlagsStorage<QTextDocument::FindFlag>.i =
         (QFlagsStorage<QTextDocument::FindFlag>)
         QFlags<QTextDocument::FindFlag>::operator&
                   ((QFlags<QTextDocument::FindFlag> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_40);
    if (IVar2 == 0) break;
    iVar3 = QRegularExpressionMatch::capturedLength((int)&local_38);
    if (local_a0 == 0) {
LAB_007ad729:
      lVar5 = (long)(local_a0 + iVar3);
      qVar4 = QString::size(&local_28);
      local_aa = false;
      if (lVar5 != qVar4) {
        local_44 = (char16_t)
                   QString::at(in_stack_ffffffffffffff28,
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        local_aa = QChar::isLetterOrNumber((QChar *)0x7ad77a);
      }
      local_a9 = local_aa;
    }
    else {
      local_42 = (char16_t)
                 QString::at(in_stack_ffffffffffffff28,
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      bVar1 = QChar::isLetterOrNumber((QChar *)0x7ad71c);
      local_a9 = true;
      if (!bVar1) goto LAB_007ad729;
    }
    if (local_a9 == false) break;
    local_48.super_QFlagsStorage<QTextDocument::FindFlag>.i =
         (QFlagsStorage<QTextDocument::FindFlag>)
         QFlags<QTextDocument::FindFlag>::operator&
                   ((QFlags<QTextDocument::FindFlag> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_48);
    if (IVar2 == 0) {
      local_bc = local_a0 + iVar3 + 1;
    }
    else {
      local_bc = local_a0 + -1;
    }
    local_6c = local_bc;
  }
  d = QTextDocumentPrivate::get(in_RDI);
  QTextBlock::position((QTextBlock *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QTextCursorPrivate::fromPosition(d,in_stack_ffffffffffffff24);
  QTextCursor::operator=
            ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (QTextCursor *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QTextCursor::~QTextCursor((QTextCursor *)0x7ad840);
  iVar3 = QTextCursor::position
                    ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  this = (QTextCursor *)(long)iVar3;
  QRegularExpressionMatch::capturedLength((int)&local_38);
  QTextCursor::setPosition(this,(int)((ulong)in_R8 >> 0x20),(MoveMode)in_R8);
  local_51 = true;
LAB_007ad8a8:
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_38);
  QString::~QString((QString *)0x7ad8c2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

static bool findInBlock(const QTextBlock &block, const QRegularExpression &expr, int offset,
                        QTextDocument::FindFlags options, QTextCursor *cursor)
{
    QString text = block.text();
    text.replace(QChar::Nbsp, u' ');
    QRegularExpressionMatch match;
    int idx = -1;

    while (offset >= 0 && offset <= text.size()) {
        idx = (options & QTextDocument::FindBackward) ?
               text.lastIndexOf(expr, offset, &match) : text.indexOf(expr, offset, &match);
        if (idx == -1)
            return false;

        if (options & QTextDocument::FindWholeWords) {
            const int start = idx;
            const int end = start + match.capturedLength();
            if ((start != 0 && text.at(start - 1).isLetterOrNumber())
                || (end != text.size() && text.at(end).isLetterOrNumber())) {
                //if this is not a whole word, continue the search in the string
                offset = (options & QTextDocument::FindBackward) ? idx-1 : end+1;
                idx = -1;
                continue;
            }
        }
        //we have a hit, return the cursor for that.
        *cursor = QTextCursorPrivate::fromPosition(const_cast<QTextDocumentPrivate *>(QTextDocumentPrivate::get(block)),
                                                   block.position() + idx);
        cursor->setPosition(cursor->position() + match.capturedLength(), QTextCursor::KeepAnchor);
        return true;
    }
    return false;
}